

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_java_struct_definition
          (t_javame_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  t_struct *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  uint uVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  size_type sVar7;
  undefined4 extraout_var_00;
  t_const_value *ptVar8;
  undefined4 extraout_var_01;
  t_type *ptVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference pptVar10;
  string *psVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *pcVar12;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  byte local_1b1;
  t_type *ptStack_1b0;
  bool can_be_null;
  t_type *type;
  string field_name;
  t_field *field;
  t_field **local_178;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_170
  ;
  t_field **local_168;
  string local_160;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_140
  ;
  t_field **local_138;
  byte local_129;
  undefined1 local_128 [7];
  bool first;
  t_type *local_108;
  t_type *t;
  t_field **local_f8;
  byte local_e9;
  undefined1 local_e8 [7];
  bool all_optional_members;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  t_field **local_c0;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  t_field **local_88;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_80;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  allocator local_51;
  key_type local_50;
  _Self local_30;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  bool is_final;
  bool is_result_local;
  bool in_class_local;
  t_struct *ptStack_20;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  local_23 = is_result;
  local_22 = in_class;
  local_21 = is_exception;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,out,tstruct);
  ptVar9 = &ptStack_20->super_t_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"final",&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&ptVar9->annotations_,&local_50);
  members = (vector<t_field_*,_std::allocator<t_field_*>_> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&(ptStack_20->super_t_type).annotations_);
  bVar2 = std::operator!=(&local_30,(_Self *)&members);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_24 = bVar2;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"public ");
  pcVar12 = "";
  if ((local_24 & 1) != 0) {
    pcVar12 = "final ";
  }
  poVar6 = std::operator<<(poVar6,pcVar12);
  pcVar12 = "";
  if ((local_22 & 1) != 0) {
    pcVar12 = "static ";
  }
  poVar6 = std::operator<<(poVar6,pcVar12);
  poVar6 = std::operator<<(poVar6,"class ");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar3));
  std::operator<<(poVar6," ");
  if ((local_21 & 1) != 0) {
    std::operator<<((ostream *)tstruct_local,"extends Exception ");
  }
  std::operator<<((ostream *)tstruct_local,"implements TBase ");
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tstruct_local);
  generate_struct_desc(this,(ostream *)tstruct_local,ptStack_20);
  m_iter._M_current = (t_field **)t_struct::get_members(ptStack_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_80);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  generate_field_descs(this,(ostream *)tstruct_local,ptStack_20);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  local_88 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_80._M_current = local_88;
  while( true ) {
    local_90._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_80,&local_90);
    if (!bVar2) break;
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    std::operator<<(poVar6,"private ");
    ptVar1 = tstruct_local;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_80);
    declare_field_abi_cxx11_((string *)local_b0,this,*pptVar10,false);
    poVar6 = std::operator<<((ostream *)ptVar1,(string *)local_b0);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_b0);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_80);
  }
  sVar7 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  if (sVar7 != 0) {
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"// isset id assignments");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    local_b4 = 0;
    local_c0 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_80._M_current = local_c0;
    while( true ) {
      local_c8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_80,&local_c8);
      if (!bVar2) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_80);
      ptVar9 = t_field::get_type(*pptVar10);
      bVar2 = type_can_be_null(this,ptVar9);
      if (!bVar2) {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"private static final int ");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        isset_field_id_abi_cxx11_((string *)local_e8,this,*pptVar10);
        poVar6 = std::operator<<(poVar6,(string *)local_e8);
        poVar6 = std::operator<<(poVar6," = ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b4);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_e8);
        local_b4 = local_b4 + 1;
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_80);
    }
    if (0 < local_b4) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"private boolean[] __isset_vector = new boolean[");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_b4);
      poVar6 = std::operator<<(poVar6,"];");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  }
  local_e9 = 1;
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"public ");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar6 = std::operator<<(poVar6,"() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_f8 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_80._M_current = local_f8;
  while( true ) {
    t = (t_type *)
        std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                  ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&t);
    if (!bVar2) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_80);
    ptVar9 = t_field::get_type(*pptVar10);
    local_108 = t_generator::get_true_type(ptVar9);
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_80);
    ptVar8 = t_field::get_value(*pptVar10);
    ptVar1 = tstruct_local;
    if (ptVar8 != (t_const_value *)0x0) {
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_80);
      psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "this.",psVar11);
      ptVar9 = local_108;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_80);
      ptVar8 = t_field::get_value(*pptVar10);
      print_const_value(this,(ostream *)ptVar1,(string *)local_128,ptVar9,ptVar8,true,true);
      std::__cxx11::string::~string((string *)local_128);
    }
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_80);
    eVar4 = t_field::get_req(*pptVar10);
    if (eVar4 != T_OPTIONAL) {
      local_e9 = 0;
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_80);
  }
  t_generator::indent_down((t_generator *)this);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  bVar2 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  if ((!bVar2) && ((local_e9 & 1) == 0)) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"public ");
    iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar6 = std::operator<<(poVar6,"(");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_129 = 1;
    local_138 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_80._M_current = local_138;
    while( true ) {
      local_140._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_80,&local_140);
      if (!bVar2) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_80);
      eVar4 = t_field::get_req(*pptVar10);
      if (eVar4 != T_OPTIONAL) {
        if ((local_129 & 1) == 0) {
          poVar6 = std::operator<<((ostream *)tstruct_local,",");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        }
        local_129 = 0;
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        ptVar9 = t_field::get_type(*pptVar10);
        type_name_abi_cxx11_(&local_160,this,ptVar9,false,false,false);
        poVar6 = std::operator<<(poVar6,(string *)&local_160);
        poVar6 = std::operator<<(poVar6," ");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
        std::operator<<(poVar6,(string *)psVar11);
        std::__cxx11::string::~string((string *)&local_160);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_80);
    }
    poVar6 = std::operator<<((ostream *)tstruct_local,")");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"{");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"this();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    local_168 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
    local_80._M_current = local_168;
    while( true ) {
      local_170._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_80,&local_170);
      if (!bVar2) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_80);
      eVar4 = t_field::get_req(*pptVar10);
      if (eVar4 != T_OPTIONAL) {
        poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar6 = std::operator<<(poVar6,"this.");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
        poVar6 = std::operator<<(poVar6,(string *)psVar11);
        poVar6 = std::operator<<(poVar6," = ");
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
        poVar6 = std::operator<<(poVar6,(string *)psVar11);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        ptVar1 = tstruct_local;
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_80);
        generate_isset_set(this,(ostream *)ptVar1,*pptVar10);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_80);
    }
    t_generator::indent_down((t_generator *)this);
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,"}");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"/**");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6," * Performs a deep copy on <i>other</i>.");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6," */");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"public ");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_02,iVar3));
  poVar6 = std::operator<<(poVar6,"(");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_03,iVar3));
  poVar6 = std::operator<<(poVar6," other) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  bVar2 = has_bit_vector(this,ptStack_20);
  if (bVar2) {
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar6 = std::operator<<(poVar6,
                             "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, other.__isset_vector.length);"
                            );
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  local_178 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_80._M_current = local_178;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar2) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_80);
    field_name.field_2._8_8_ = *pptVar10;
    psVar11 = t_field::get_name_abi_cxx11_((t_field *)field_name.field_2._8_8_);
    std::__cxx11::string::string((string *)&type,(string *)psVar11);
    ptStack_1b0 = t_field::get_type((t_field *)field_name.field_2._8_8_);
    local_1b1 = type_can_be_null(this,ptStack_1b0);
    if ((bool)local_1b1) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"if (other.");
      generate_isset_check_abi_cxx11_(&local_1d8,this,(t_field *)field_name.field_2._8_8_);
      poVar6 = std::operator<<(poVar6,(string *)&local_1d8);
      poVar6 = std::operator<<(poVar6,") {");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1d8);
      t_generator::indent_up((t_generator *)this);
    }
    uVar5 = (*(ptStack_1b0->super_t_doc)._vptr_t_doc[0xd])();
    ptVar1 = tstruct_local;
    if ((uVar5 & 1) == 0) {
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"this.");
      poVar6 = std::operator<<(poVar6,(string *)&type);
      std::operator<<(poVar6," = ");
      ptVar1 = tstruct_local;
      std::operator+(&local_260,"other.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
      std::__cxx11::string::string((string *)&local_280,(string *)&type);
      generate_deep_copy_non_container(this,(ostream *)ptVar1,&local_260,&local_280,ptStack_1b0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_260);
      poVar6 = std::operator<<((ostream *)tstruct_local,";");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f8,"other",&local_1f9);
      std::__cxx11::string::string((string *)&local_220,(string *)&type);
      std::operator+(&local_240,"__this__",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
      generate_deep_copy_container
                (this,(ostream *)ptVar1,&local_1f8,&local_220,&local_240,ptStack_1b0);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"this.");
      poVar6 = std::operator<<(poVar6,(string *)&type);
      poVar6 = std::operator<<(poVar6," = __this__");
      poVar6 = std::operator<<(poVar6,(string *)&type);
      poVar6 = std::operator<<(poVar6,";");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    if ((local_1b1 & 1) != 0) {
      t_generator::indent_down((t_generator *)this);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar6 = std::operator<<(poVar6,"}");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&type);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_80);
  }
  t_generator::indent_down((t_generator *)this);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"public ");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_04,iVar3));
  poVar6 = std::operator<<(poVar6," deepCopy() {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"  return new ");
  iVar3 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_05,iVar3));
  poVar6 = std::operator<<(poVar6,"(this);");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  generate_java_struct_clear(this,(ostream *)tstruct_local,ptStack_20);
  generate_java_bean_boilerplate(this,(ostream *)tstruct_local,ptStack_20);
  generate_generic_field_getters_setters(this,(ostream *)tstruct_local,ptStack_20);
  generate_java_struct_equality(this,(ostream *)tstruct_local,ptStack_20);
  generate_java_struct_compare_to(this,(ostream *)tstruct_local,ptStack_20);
  generate_java_struct_reader(this,(ostream *)tstruct_local,ptStack_20);
  if ((local_23 & 1) == 0) {
    generate_java_struct_writer(this,(ostream *)tstruct_local,ptStack_20);
  }
  else {
    generate_java_struct_result_writer(this,(ostream *)tstruct_local,ptStack_20);
  }
  generate_java_struct_tostring(this,(ostream *)tstruct_local,ptStack_20);
  generate_java_validator(this,(ostream *)tstruct_local,ptStack_20);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception,
                                                         bool in_class,
                                                         bool is_result) {
  generate_java_doc(out, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());

  indent(out) << "public " << (is_final ? "final " : "") << (in_class ? "static " : "") << "class "
              << tstruct->get_name() << " ";

  if (is_exception) {
    out << "extends Exception ";
  }
  out << "implements TBase ";

  scope_up(out);

  generate_struct_desc(out, tstruct);

  // Members are public for -java, private for -javabean
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  out << endl;

  generate_field_descs(out, tstruct);

  out << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "private ";
    out << declare_field(*m_iter, false) << endl;
  }

  // isset data
  if (members.size() > 0) {
    out << endl;

    indent(out) << "// isset id assignments" << endl;

    int i = 0;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (!type_can_be_null((*m_iter)->get_type())) {
        indent(out) << "private static final int " << isset_field_id(*m_iter) << " = " << i << ";"
                    << endl;
        i++;
      }
    }

    if (i > 0) {
      indent(out) << "private boolean[] __isset_vector = new boolean[" << i << "];" << endl;
    }

    out << endl;
  }

  bool all_optional_members = true;

  // Default constructor
  indent(out) << "public " << tstruct->get_name() << "() {" << endl;
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      print_const_value(out,
                        "this." + (*m_iter)->get_name(),
                        t,
                        (*m_iter)->get_value(),
                        true,
                        true);
    }
    if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
      all_optional_members = false;
    }
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  if (!members.empty() && !all_optional_members) {
    // Full constructor for all fields
    indent(out) << "public " << tstruct->get_name() << "(" << endl;
    indent_up();
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        if (!first) {
          out << "," << endl;
        }
        first = false;
        indent(out) << type_name((*m_iter)->get_type()) << " " << (*m_iter)->get_name();
      }
    }
    out << ")" << endl;
    indent_down();
    indent(out) << "{" << endl;
    indent_up();
    indent(out) << "this();" << endl;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        indent(out) << "this." << (*m_iter)->get_name() << " = " << (*m_iter)->get_name() << ";"
                    << endl;
        generate_isset_set(out, (*m_iter));
      }
    }
    indent_down();
    indent(out) << "}" << endl << endl;
  }

  // copy constructor
  indent(out) << "/**" << endl;
  indent(out) << " * Performs a deep copy on <i>other</i>." << endl;
  indent(out) << " */" << endl;
  indent(out) << "public " << tstruct->get_name() << "(" << tstruct->get_name() << " other) {"
              << endl;
  indent_up();

  if (has_bit_vector(tstruct)) {
    indent(out) << "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, "
                   "other.__isset_vector.length);" << endl;
  }

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);
    std::string field_name = field->get_name();
    t_type* type = field->get_type();
    bool can_be_null = type_can_be_null(type);

    if (can_be_null) {
      indent(out) << "if (other." << generate_isset_check(field) << ") {" << endl;
      indent_up();
    }

    if (type->is_container()) {
      generate_deep_copy_container(out, "other", field_name, "__this__" + field_name, type);
      indent(out) << "this." << field_name << " = __this__" << field_name << ";" << endl;
    } else {
      indent(out) << "this." << field_name << " = ";
      generate_deep_copy_non_container(out, "other." + field_name, field_name, type);
      out << ";" << endl;
    }

    if (can_be_null) {
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;

  // clone method, so that you can deep copy an object when you don't know its class.
  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  generate_java_struct_clear(out, tstruct);

  generate_java_bean_boilerplate(out, tstruct);
  generate_generic_field_getters_setters(out, tstruct);

  generate_java_struct_equality(out, tstruct);
  generate_java_struct_compare_to(out, tstruct);

  generate_java_struct_reader(out, tstruct);
  if (is_result) {
    generate_java_struct_result_writer(out, tstruct);
  } else {
    generate_java_struct_writer(out, tstruct);
  }
  generate_java_struct_tostring(out, tstruct);
  generate_java_validator(out, tstruct);
  scope_down(out);
  out << endl;
}